

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::
     rotate<(InstructionSet::M68k::Operation)87,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  byte bVar1;
  uint uVar2;
  
  flow_controller->dynamic_instruction_length_ = (source & 0x3f) + 2;
  if ((source & 0x3f) == 0) {
    uVar2 = 0;
  }
  else {
    if ((source & 0x1f) != 0) {
      bVar1 = (byte)source & 0x1f;
      *destination = *destination << bVar1 | *destination >> 0x20 - bVar1;
    }
    uVar2 = *destination & 1;
  }
  status->carry_flag = (ulong)uVar2;
  uVar2 = *destination;
  status->zero_result = (ulong)uVar2;
  status->negative_flag = (ulong)(uVar2 & 0x80000000);
  status->overflow_flag = 0;
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}